

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigUtil.c
# Opt level: O0

void Aig_ObjPrintVerbose(Aig_Obj_t *pObj,int fHaig)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Aig_Obj_t *pAVar4;
  char *pcVar5;
  char *pcVar6;
  int fHaig_local;
  Aig_Obj_t *pObj_local;
  
  iVar2 = Aig_IsComplement(pObj);
  if (iVar2 != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/aig/aigUtil.c"
                  ,0x28f,"void Aig_ObjPrintVerbose(Aig_Obj_t *, int)");
  }
  printf("Node %d : ",(ulong)(uint)pObj->Id);
  iVar2 = Aig_ObjIsConst1(pObj);
  if (iVar2 == 0) {
    iVar2 = Aig_ObjIsCi(pObj);
    if (iVar2 == 0) {
      iVar2 = Aig_ObjIsCo(pObj);
      if (iVar2 == 0) {
        pAVar4 = Aig_ObjFanin0(pObj);
        uVar3 = pAVar4->Id;
        iVar2 = Aig_ObjFaninC0(pObj);
        pcVar5 = " ";
        if (iVar2 != 0) {
          pcVar5 = "\'";
        }
        pAVar4 = Aig_ObjFanin1(pObj);
        uVar1 = pAVar4->Id;
        iVar2 = Aig_ObjFaninC1(pObj);
        pcVar6 = " ";
        if (iVar2 != 0) {
          pcVar6 = "\'";
        }
        printf("AND( %d%s, %d%s )",(ulong)uVar3,pcVar5,(ulong)uVar1,pcVar6);
      }
      else {
        printf("CO( ");
        pAVar4 = Aig_ObjFanin0(pObj);
        uVar3 = pAVar4->Id;
        iVar2 = Aig_ObjFaninC0(pObj);
        pcVar5 = " ";
        if (iVar2 != 0) {
          pcVar5 = "\'";
        }
        printf("%d%s )",(ulong)uVar3,pcVar5);
      }
    }
    else {
      printf("CI");
    }
  }
  else {
    printf("constant 1");
  }
  uVar3 = Aig_ObjRefs(pObj);
  printf(" (refs = %3d)",(ulong)uVar3);
  return;
}

Assistant:

void Aig_ObjPrintVerbose( Aig_Obj_t * pObj, int fHaig )
{
    assert( !Aig_IsComplement(pObj) );
    printf( "Node %d : ", pObj->Id );
    if ( Aig_ObjIsConst1(pObj) )
        printf( "constant 1" );
    else if ( Aig_ObjIsCi(pObj) )
        printf( "CI" );
    else if ( Aig_ObjIsCo(pObj) )
    {
        printf( "CO( " );
        printf( "%d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " ") );
    }
    else
        printf( "AND( %d%s, %d%s )", 
            Aig_ObjFanin0(pObj)->Id, (Aig_ObjFaninC0(pObj)? "\'" : " "), 
            Aig_ObjFanin1(pObj)->Id, (Aig_ObjFaninC1(pObj)? "\'" : " ") );
    printf( " (refs = %3d)", Aig_ObjRefs(pObj) );
}